

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O0

void test_bson_iter_timeval(void)

{
  byte bVar1;
  timeval tv;
  bson_t *b;
  bson_iter_t iter;
  long local_118;
  long local_110;
  bson_t *local_108;
  undefined1 local_100 [248];
  
  local_108 = get_bson(
                      "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/test26.bson"
                      );
  if (local_108 == (bson_t *)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0xb9,"test_bson_iter_timeval","b");
    abort();
  }
  bVar1 = bson_iter_init(local_100,local_108);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0xbb,"test_bson_iter_timeval","bson_iter_init (&iter, b)");
    abort();
  }
  bVar1 = bson_iter_next(local_100);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0xbc,"test_bson_iter_timeval","bson_iter_next (&iter)");
    abort();
  }
  bson_iter_timeval(local_100,&local_118);
  if (local_118 != 0x499602d2) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0xbe,"test_bson_iter_timeval","tv.tv_sec == 1234567890");
    abort();
  }
  if (local_110 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0xbf,"test_bson_iter_timeval","tv.tv_usec == 0");
    abort();
  }
  bson_destroy(local_108);
  return;
}

Assistant:

static void
test_bson_iter_timeval (void)
{
   bson_iter_t iter;
   bson_t *b;
   struct timeval tv;

   b = get_bson (BINARY_DIR "/test26.bson");
   BSON_ASSERT (b);

   BSON_ASSERT (bson_iter_init (&iter, b));
   BSON_ASSERT (bson_iter_next (&iter));
   bson_iter_timeval (&iter, &tv);
   BSON_ASSERT (tv.tv_sec == 1234567890);
   BSON_ASSERT (tv.tv_usec == 0);

   bson_destroy (b);
}